

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.hpp
# Opt level: O3

void Qentem::Memory::Swap<Qentem::HAItem_T<Qentem::String<char16_t>,Qentem::Value<char16_t>>>
               (HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *item1,
               HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> *item2)

{
  Value<char16_t> *this;
  SizeT SVar1;
  char16_t *pcVar2;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> item;
  HAItem_T<Qentem::String<char16_t>,_Qentem::Value<char16_t>_> local_50;
  
  local_50.Key.storage_ = (item1->Key).storage_;
  this = &local_50.Value;
  local_50.Key.length_ = (item1->Key).length_;
  (item1->Key).length_ = 0;
  (item1->Key).storage_ = (char16_t *)0x0;
  local_50.Hash = item1->Hash;
  local_50.Next = item1->Next;
  Value<char16_t>::Value(this,&item1->Value);
  if (item1 != item2) {
    String<char16_t>::deallocate(&item1->Key);
    (item1->Key).storage_ = (item2->Key).storage_;
    (item1->Key).length_ = (item2->Key).length_;
    (item2->Key).storage_ = (char16_t *)0x0;
    (item2->Key).length_ = 0;
  }
  SVar1 = item2->Next;
  item1->Hash = item2->Hash;
  item1->Next = SVar1;
  Value<char16_t>::operator=(&item1->Value,&item2->Value);
  if (&local_50 != item2) {
    String<char16_t>::deallocate(&item2->Key);
    (item2->Key).storage_ = local_50.Key.storage_;
    (item2->Key).length_ = local_50.Key.length_;
    local_50.Key.storage_ = (char16_t *)0x0;
    local_50.Key.length_ = 0;
  }
  item2->Hash = local_50.Hash;
  item2->Next = local_50.Next;
  Value<char16_t>::operator=(&item2->Value,this);
  Value<char16_t>::~Value(this);
  pcVar2 = local_50.Key.storage_;
  if (local_50.Key.storage_ != (char16_t *)0x0) {
    MemoryRecord::RemoveAllocation(local_50.Key.storage_);
  }
  operator_delete(pcVar2);
  return;
}

Assistant:

inline static void Swap(Type_T &item1, Type_T &item2) noexcept {
    Type_T item = Move(item1);
    item1       = Move(item2);
    item2       = Move(item);
}